

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarIntG8IU.h
# Opt level: O2

void __thiscall FastPForLib::VarIntG8IU::VarIntG8IU(VarIntG8IU *this)

{
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  int desc;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  char cVar9;
  long lVar10;
  char cVar11;
  int aiStack_2048 [8];
  undefined1 local_2028 [16];
  undefined1 auStack_2018 [8088];
  int ithSize [8];
  
  (this->super_IntegerCODEC)._vptr_IntegerCODEC = (_func_int **)&PTR_encodeArray_001bba00;
  puVar2 = local_2028;
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    uVar5 = 1;
    uVar6 = 0;
    iVar4 = -1;
    for (iVar7 = 0; iVar7 != 8; iVar7 = iVar7 + 1) {
      if ((uVar5 & (uint)lVar3) == 0) {
        aiStack_2048[(int)uVar6] = iVar7 - iVar4;
        uVar6 = uVar6 + 1;
        iVar4 = iVar7;
      }
      uVar5 = uVar5 * 2;
    }
    this->maskOutputSize[lVar3] = uVar6;
    cVar9 = '\0';
    lVar10 = 0;
    for (uVar8 = 0; uVar8 != (~((int)uVar6 >> 0x1f) & uVar6); uVar8 = uVar8 + 1) {
      iVar4 = aiStack_2048[uVar8];
      lVar10 = (long)(int)lVar10;
      for (iVar7 = 0; iVar7 != 4; iVar7 = iVar7 + 1) {
        cVar11 = -1;
        if (iVar7 < iVar4) {
          cVar11 = cVar9;
        }
        puVar2[lVar10] = cVar11;
        cVar9 = cVar9 + (iVar7 < iVar4);
        lVar10 = lVar10 + 1;
      }
    }
    puVar2 = puVar2 + 0x20;
  }
  for (lVar3 = 0; lVar3 != 0x2000; lVar3 = lVar3 + 0x20) {
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(local_2028 + lVar3));
    *(undefined1 (*) [16])((long)this->vecmask[0][0] + lVar3) = auVar1;
    auVar1 = vlddqu_avx(*(undefined1 (*) [16])(auStack_2018 + lVar3));
    *(undefined1 (*) [16])((long)this->vecmask[0][1] + lVar3) = auVar1;
  }
  return;
}

Assistant:

VarIntG8IU() {
    char mask[256][32];
    for (int desc = 0; desc <= 255; desc++) {
      int bitmask = 0x00000001;
      int bitindex = 0;
      // count number of 0 in the char
      int complete = 0;
      int ithSize[8];
      int lastpos = -1;
      while (bitindex < 8) {
        if ((desc & bitmask) == 0) {
          ithSize[complete] = bitindex - lastpos;
          lastpos = bitindex;
          complete++;
        }
        bitindex++;
        bitmask = bitmask << 1;
      }
      maskOutputSize[desc] = complete;

      int j = 0;
      int k = 0;
      for (int i = 0; i < complete; i++) {
        for (int n = 0; n < 4; n++) {
          if (n < ithSize[i]) {
            mask[desc][k] = static_cast<unsigned char>(j);
            j = j + 1;
          } else {
            mask[desc][k] = -1;
          }
          k = k + 1;
        }
      }
    }
    for (int desc = 0; desc <= 255; desc++) {
      vecmask[desc][0] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc]));
      vecmask[desc][1] =
          _mm_lddqu_si128(reinterpret_cast<__m128i const *>(mask[desc] + 16));
    }
  }